

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_options_common<char>::~basic_json_options_common
          (basic_json_options_common<char> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_options_common_00b59150;
  pcVar1 = (this->neginf_to_str_)._M_dataplus._M_p;
  paVar2 = &(this->neginf_to_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->inf_to_str_)._M_dataplus._M_p;
  paVar2 = &(this->inf_to_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->nan_to_str_)._M_dataplus._M_p;
  paVar2 = &(this->nan_to_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->neginf_to_num_)._M_dataplus._M_p;
  paVar2 = &(this->neginf_to_num_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->inf_to_num_)._M_dataplus._M_p;
  paVar2 = &(this->inf_to_num_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->nan_to_num_)._M_dataplus._M_p;
  paVar2 = &(this->nan_to_num_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~basic_json_options_common() = default;